

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions.c
# Opt level: O3

_InstInfo * inst_vex_mod_lookup(_CodeInfo *ci,_InstNode in,_InstInfo *ii,uint index)

{
  ushort uVar1;
  int iVar2;
  uint8_t *puVar3;
  _InstInfo *p_Var4;
  
  puVar3 = ci->code;
  ci->code = puVar3 + 1;
  iVar2 = ci->codeLen;
  ci->codeLen = iVar2 + -1;
  if (0 < iVar2) {
    if (0xbf < puVar3[1]) {
      return ii;
    }
    uVar1 = InstructionsTree[(ulong)(index + (in & 0x1fff)) + 4];
    if (uVar1 != 0) {
      p_Var4 = (_InstInfo *)
               ((long)&InstInfosEx[0].BASE.sharedIndex + (ulong)((uVar1 & 0x1fff) * 0xc));
      if ((uVar1 & 0xe000) == 0x2000) {
        p_Var4 = (_InstInfo *)((long)&InstInfos[0].sharedIndex + (ulong)((uVar1 & 0x1fff) * 4));
      }
      return p_Var4;
    }
  }
  return (_InstInfo *)0x0;
}

Assistant:

static _InstInfo* inst_vex_mod_lookup(_CodeInfo* ci, _InstNode in, _InstInfo* ii, unsigned int index)
{
	/* Advance to read the MOD from ModRM byte. */
	ci->code += 1;
	ci->codeLen -= 1;
	if (ci->codeLen < 0) return NULL;
	if (*ci->code < INST_DIVIDED_MODRM) {
		/* MOD is not 11, therefore change the index to 8 - 12 range in the prefixed table. */
		index += 4;
		/* Make a second lookup for this special instruction. */
		return inst_get_info(in, index);
	}
	/* Return the original one, in case we didn't find a suited instruction. */
	return ii;
}